

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O2

void __thiscall ContextTest_StringFormat_Test::TestBody(ContextTest_StringFormat_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_398;
  allocator local_389;
  AssertionResult gtest_ar;
  string local_378;
  CcsDomain ccs;
  CcsContext root;
  CcsContext ctx;
  __shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> local_330;
  __shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> local_320;
  ostringstream os;
  string local_308 [368];
  istringstream input;
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  std::__cxx11::string::string((string *)&os,"b c : @constrain d.e",(allocator *)&local_378);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&os,_S_in);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"<literal>",(allocator *)&local_378);
  ::ccs::CcsDomain::loadCcsStream
            (&ccs,(istream *)&input,(string *)&os,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&os);
  ::ccs::CcsDomain::build((CcsDomain *)&root);
  std::__cxx11::string::string((string *)&os,"c",(allocator *)&AStack_398);
  ::ccs::CcsContext::CcsContext((CcsContext *)&gtest_ar,&root,(string *)&os);
  std::__cxx11::string::string((string *)&local_378,"b",&local_389);
  ::ccs::CcsContext::CcsContext(&ctx,(CcsContext *)&gtest_ar,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_320,(__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)&ctx);
  ::ccs::operator<<((ostream *)&os,(CcsContext *)&local_320);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_320._M_refcount);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"c > b/d.e\"","os.str()",(char (*) [10])0x1632c4,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&AStack_398);
    if ((long *)local_378._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_378._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_378,"",(allocator *)&gtest_ar);
  std::__cxx11::stringbuf::str(local_308);
  std::__cxx11::string::~string((string *)&local_378);
  std::__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_330,(__shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2> *)&root);
  ::ccs::operator<<((ostream *)&os,(CcsContext *)&local_330);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330._M_refcount);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<root>\"","os.str()",(char (*) [7])"<root>",&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_378);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x18,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper(&AStack_398);
    if ((long *)local_378._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_378._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(ContextTest, StringFormat) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").constrain("b");

  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());

  os.str("");
  os << root;
  EXPECT_EQ("<root>", os.str());
}